

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaOutputFile::setFrameBuffer
          (RgbaOutputFile *this,Rgba *base,size_t xStride,size_t yStride)

{
  ToYca *in_RCX;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  FrameBuffer fb;
  size_t ys;
  size_t xs;
  FrameBuffer *in_stack_00000140;
  lock_guard<std::mutex> lock;
  FrameBuffer *in_stack_00000448;
  OutputFile *in_stack_00000450;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Slice local_158;
  Slice local_120;
  Slice local_e8;
  Slice local_b0;
  size_t local_48;
  size_t local_40;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  Rgba *in_stack_ffffffffffffffd8;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_40 = in_RDX << 3;
    local_48 = (long)in_RCX << 3;
    FrameBuffer::FrameBuffer((FrameBuffer *)0x21f8c6);
    Slice::Slice(&local_b0,HALF,in_RSI,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_stack_00000140,(char *)xs,(Slice *)ys);
    Slice::Slice(&local_e8,HALF,in_RSI + 2,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_stack_00000140,(char *)xs,(Slice *)ys);
    Slice::Slice(&local_120,HALF,in_RSI + 4,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_stack_00000140,(char *)xs,(Slice *)ys);
    Slice::Slice(&local_158,HALF,in_RSI + 6,local_40,local_48,1,1,0.0,false,false);
    FrameBuffer::insert(in_stack_00000140,(char *)xs,(Slice *)ys);
    OutputFile::setFrameBuffer(in_stack_00000450,in_stack_00000448);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x21fa8b);
  }
  else {
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (mutex_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ToYca::setFrameBuffer
              (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21f866);
  }
  return;
}

Assistant:

void
RgbaOutputFile::setFrameBuffer (
    const Rgba* base, size_t xStride, size_t yStride)
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        _toYca->setFrameBuffer (base, xStride, yStride);
    }
    else
    {
        size_t xs = xStride * sizeof (Rgba);
        size_t ys = yStride * sizeof (Rgba);

        FrameBuffer fb;

        fb.insert ("R", Slice (HALF, (char*) &base[0].r, xs, ys));
        fb.insert ("G", Slice (HALF, (char*) &base[0].g, xs, ys));
        fb.insert ("B", Slice (HALF, (char*) &base[0].b, xs, ys));
        fb.insert ("A", Slice (HALF, (char*) &base[0].a, xs, ys));

        _outputFile->setFrameBuffer (fb);
    }
}